

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool PrepareNonBlankMultiLine(char **p)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = SkipBlanks(p);
  bVar2 = iVar1 == 0;
  if (!bVar2) {
    if (listmacro != 0) goto LAB_00121ea8;
    do {
      do {
        ListFile(false);
        iVar1 = ReadLine(true);
        if (iVar1 == 0) {
          return bVar2;
        }
        PrepareLine();
        *p = lp;
        iVar1 = SkipBlanks(p);
        bVar2 = iVar1 == 0;
        if (bVar2) {
          return bVar2;
        }
      } while (listmacro == 0);
LAB_00121ea8:
    } while (lijstp != (CStringsList *)0x0);
  }
  return bVar2;
}

Assistant:

bool PrepareNonBlankMultiLine(char*& p) {
	// loop while the current line is blank-only (read further lines until EOF or non-blank char)
	while (SkipBlanks(p)) {
		// if inside macro system, but without any more macro-lines in buffer, act as if "EOF"
		// (to not leak into reading actual file while the macro is executing)
		if (listmacro && nullptr == lijstp) return false;
		// list the current (old) line
		ListFile();
		// read the next line
		if (!ReadLine()) return false;
		PrepareLine();
		p = lp;
	}
	return true;
}